

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

void __thiscall aiString::aiString(aiString *this,aiString *rOther)

{
  ai_uint32 aVar1;
  aiString *rOther_local;
  aiString *this_local;
  
  this->length = rOther->length;
  if (this->length < 0x400) {
    aVar1 = this->length;
  }
  else {
    aVar1 = 0x3ff;
  }
  this->length = aVar1;
  memcpy(this->data,rOther->data,(ulong)this->length);
  this->data[this->length] = '\0';
  return;
}

Assistant:

aiString(const aiString& rOther)
    : length(rOther.length)
    {
        // Crop the string to the maximum length
        length = length>=MAXLEN?MAXLEN-1:length;
        memcpy( data, rOther.data, length);
        data[length] = '\0';
    }